

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

bool find_solution(int step,int R,int G,int L,int S,int X,bool jumped,
                  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *solution)

{
  bool bVar1;
  ostream *poVar2;
  allocator<char> local_d1;
  value_type local_d0;
  allocator<char> local_a9;
  value_type local_a8;
  allocator<char> local_81;
  value_type local_80;
  allocator<char> local_49;
  value_type local_48;
  byte local_25;
  int local_24;
  int iStack_20;
  bool jumped_local;
  int X_local;
  int S_local;
  int L_local;
  int G_local;
  int R_local;
  int step_local;
  
  local_25 = jumped;
  if ((((X < R + G) && (R <= X)) || (R + G + L <= X)) || (S < 0)) {
    R_local._3_1_ = false;
  }
  else if (((S == 0) && (X < R + G + L)) && ((R + G < X && (jumped)))) {
    R_local._3_1_ = true;
  }
  else {
    local_24 = X;
    iStack_20 = S;
    X_local = L;
    S_local = G;
    L_local = R;
    G_local = step;
    if ((((S < 1) || (S <= G + 1)) && (!jumped)) ||
       (((X < R && (R + G < X + S + -1)) ||
        (bVar1 = find_solution(step + 1,R,G,L,S + -1,X + S + -1,jumped,solution), !bVar1)))) {
      if (((iStack_20 == 0) || ((local_24 < L_local && (L_local + S_local <= local_24 + iStack_20)))
          ) || (bVar1 = find_solution(G_local + 1,L_local,S_local,X_local,iStack_20,
                                      local_24 + iStack_20,(bool)(local_25 & 1),solution), !bVar1))
      {
        if (((iStack_20 < S_local + 1) &&
            ((L_local <= local_24 || (local_24 + iStack_20 + 1 < L_local + S_local)))) &&
           (bVar1 = find_solution(G_local + 1,L_local,S_local,X_local,iStack_20 + 1,
                                  local_24 + iStack_20 + 1,(bool)(local_25 & 1),solution), bVar1)) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,"SPEED",&local_a9);
          std::__cxx11::
          list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_front(solution,&local_a8);
          std::__cxx11::string::~string((string *)&local_a8);
          std::allocator<char>::~allocator(&local_a9);
          poVar2 = std::operator<<((ostream *)&std::cerr,"SPEED");
          std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
          R_local._3_1_ = true;
        }
        else if (((iStack_20 < 1) || (L_local + -1 != local_24)) ||
                (bVar1 = find_solution(G_local + 1,L_local,S_local,X_local,iStack_20,
                                       local_24 + iStack_20,true,solution), !bVar1)) {
          R_local._3_1_ = false;
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_d0,"JUMP",&local_d1);
          std::__cxx11::
          list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_front(solution,&local_d0);
          std::__cxx11::string::~string((string *)&local_d0);
          std::allocator<char>::~allocator(&local_d1);
          poVar2 = std::operator<<((ostream *)&std::cerr,"JUMP");
          std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
          R_local._3_1_ = true;
        }
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"WAIT",&local_81);
        std::__cxx11::
        list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_front(solution,&local_80);
        std::__cxx11::string::~string((string *)&local_80);
        std::allocator<char>::~allocator(&local_81);
        poVar2 = std::operator<<((ostream *)&std::cerr,"WAIT");
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
        R_local._3_1_ = true;
      }
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"SLOW",&local_49);
      std::__cxx11::
      list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_front(solution,&local_48);
      std::__cxx11::string::~string((string *)&local_48);
      std::allocator<char>::~allocator(&local_49);
      poVar2 = std::operator<<((ostream *)&std::cerr,"SLOW");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      R_local._3_1_ = true;
    }
  }
  return R_local._3_1_;
}

Assistant:

bool find_solution(int step, int R, int G, int L, int S, int X, bool jumped, std::list<std::string>& solution)
{
    //pad(step);
    //std::cerr << "step #" << step + 1 << std::endl;

    if ((X < R + G && X >= R)   // In down
        || X >= R + G + L       // Out of range
        || S < 0)               // Speed is negative
    {
        return false;
    }
    if (0 == S && R + G + L > X && X > R + G && jumped)
    {
        return true;
    }

    if (((0 < S && G + 1 < S) || jumped)
            && !(X < R && X + S - 1 > R + G))
    {
        //pad(step);
        //std::cerr << "Try SLOW: R == " << R << "; G == " << G << "; L == " << L << "; S == " << S << "; X == " << X << "; " << (jumped ? "already jumped" : "not jumped yet") << std::endl;
        if (find_solution(step + 1, R, G, L, S - 1, X + S - 1, jumped, solution))
        {
            solution.push_front("SLOW");
            std::cerr << "SLOW" << std::endl;
            return true;
        }
    }
    if (0 != S
            && !(X < R && X + S >= R + G))
    {
        //pad(step);
        //std::cerr << "Try WAIT: R == " << R << "; G == " << G << "; L == " << L << "; S == " << S << "; X == " << X << "; " << (jumped ? "already jumped" : "not jumped yet") << std::endl;
        if (find_solution(step + 1, R, G, L, S, X + S, jumped, solution))
        {
            solution.push_front("WAIT");
            std::cerr << "WAIT" << std::endl;
            return true;
        }
    }
    if (G + 1 > S
            && !(X < R && X + S + 1 >= R + G))
    {
        //pad(step);
        //std::cerr << "Try SPEED: R == " << R << "; G == " << G << "; L == " << L << "; S == " << S << "; X == " << X << "; " << (jumped ? "already jumped" : "not jumped yet") << std::endl;
        if (find_solution(step + 1, R, G, L, S + 1, X + S + 1, jumped, solution))
        {
            solution.push_front("SPEED");
            std::cerr << "SPEED" << std::endl;
            return true;
        }
    }
    if (0 < S
            && R - 1 == X)      // Try JUMP
    {
        //pad(step);
        //std::cerr << "Try JUMP: R == " << R << "; G == " << G << "; L == " << L << "; S == " << S << "; X == " << X << "; " << (jumped ? "already jumped" : "not jumped yet") << std::endl;
        if (find_solution(step + 1, R, G, L, S, X + S, true, solution))
        {
            solution.push_front("JUMP");
            std::cerr << "JUMP" << std::endl;
            return true;
        }
    }
    return false;
}